

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O2

void mainchan_set_input_wanted(Channel *chan,_Bool wanted)

{
  if (chan->vt == &mainchan_channelvt) {
    (**(code **)((chan[-3].vt)->open_confirmation + 0xb0))(chan[-3].vt,wanted);
    return;
  }
  __assert_fail("chan->vt == &mainchan_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c",
                0x179,"void mainchan_set_input_wanted(Channel *, _Bool)");
}

Assistant:

static void mainchan_set_input_wanted(Channel *chan, bool wanted)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);

    /*
     * This is the main channel of the SSH session, i.e. the one tied
     * to the standard input (or GUI) of the primary SSH client user
     * interface. So ssh->send_ok is how we control whether we're
     * reading from that input.
     */
    ssh_set_wants_user_input(mc->cl, wanted);
}